

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

bool __thiscall QApplication::event(QApplication *this,QEvent *e)

{
  char cVar1;
  short sVar2;
  QWidgetData *pQVar3;
  QWidgetPrivate *this_00;
  QWidget *this_01;
  QWidget **ppQVar4;
  bool bVar5;
  undefined1 uVar6;
  int msec;
  iterator iVar7;
  iterator iVar8;
  QWindow *pQVar9;
  QEvent *this_02;
  QWidget *pQVar10;
  QStyle *pQVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  QObject *pQVar15;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_68;
  undefined1 *puStack_50;
  QLocale local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = *(short *)(e + 8);
  if (sVar2 == 1) {
    lVar13 = *(long *)&this->field_0x8;
    if (*(int *)(e + 0x10) == *(int *)(lVar13 + 400)) {
      QBasicTimer::stop();
      bVar5 = QPointer::operator_cast_to_bool((QPointer *)(lVar13 + 0x1b0));
      if (bVar5) {
        pQVar10 = QWidget::window(*(QWidget **)(lVar13 + 0x1b8));
        bVar5 = QWidget::testAttribute_helper(pQVar10,WA_AlwaysShowToolTips);
        while ((bVar5 == false && (pQVar10 != (QWidget *)0x0))) {
          bVar5 = QWidget::isActiveWindow(pQVar10);
          this_01 = *(QWidget **)(*(long *)&pQVar10->field_0x8 + 0x10);
          pQVar10 = (QWidget *)0x0;
          if (this_01 != (QWidget *)0x0) {
            pQVar10 = QWidget::window(this_01);
          }
        }
        if (bVar5 != false) {
          local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_68.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
          QHelpEvent::QHelpEvent
                    ((QHelpEvent *)&local_68,ToolTip,(QPoint *)(lVar13 + 0x198),
                     (QPoint *)(lVar13 + 0x1a0));
          if ((*(long *)(lVar13 + 0x1b0) == 0) || (*(int *)(*(long *)(lVar13 + 0x1b0) + 4) == 0)) {
            pQVar15 = (QObject *)0x0;
          }
          else {
            pQVar15 = *(QObject **)(lVar13 + 0x1b8);
          }
          QCoreApplication::sendEvent(pQVar15,(QEvent *)&local_68);
          if (local_68.ptr._4_1_ == '\x01') {
            pQVar11 = QWidget::style(*(QWidget **)(lVar13 + 0x1b8));
            if ((*(long *)(lVar13 + 0x1b0) == 0) || (*(int *)(*(long *)(lVar13 + 0x1b0) + 4) == 0))
            {
              uVar12 = 0;
            }
            else {
              uVar12 = *(undefined8 *)(lVar13 + 0x1b8);
            }
            msec = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,99,0,uVar12,0);
            QBasicTimer::start((QBasicTimer *)(lVar13 + 0x194),msec,(QObject *)this);
          }
          QHelpEvent::~QHelpEvent((QHelpEvent *)&local_68);
        }
      }
    }
    else if (*(int *)(e + 0x10) == *(int *)(lVar13 + 0x194)) {
      QBasicTimer::stop();
    }
  }
  else {
    if (sVar2 == 0x7c) {
      QWhatsThis::enterWhatsThisMode();
LAB_002bd224:
      uVar6 = 1;
      goto LAB_002bd16f;
    }
    if ((sVar2 == 0x24) || (sVar2 == 0x26)) {
LAB_002bd03a:
      local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      topLevelWidgets();
      ppQVar4 = local_68.ptr;
      lVar14 = local_68.size << 3;
      for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
        pQVar10 = *(QWidget **)((long)ppQVar4 + lVar13);
        pQVar9 = QWidget::windowHandle(pQVar10);
        if ((pQVar9 == (QWindow *)0x0) &&
           ((char)(pQVar10->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                  super_QFlagsStorage<Qt::WindowType>.i != '\x11')) {
          this_02 = (QEvent *)operator_new(0x10);
          QEvent::QEvent(this_02,(uint)*(ushort *)(e + 8));
          QCoreApplication::postEvent(&pQVar10->super_QObject,this_02,0);
        }
      }
    }
    else {
      if (sVar2 != 0x58) {
        if (sVar2 != 0x59) {
          if (sVar2 == 0x14) {
            closeAllWindows();
            topLevelWidgets();
            iVar7 = QList<QWidget_*>::begin((QList<QWidget_*> *)&local_68);
            iVar8 = QList<QWidget_*>::end((QList<QWidget_*> *)&local_68);
            for (; iVar7.i != iVar8.i; iVar7.i = iVar7.i + 1) {
              pQVar10 = *iVar7.i;
              pQVar3 = pQVar10->data;
              if (((pQVar3->field_0x11 & 2) == 0) && ((pQVar3->widget_attributes & 0x8000) != 0)) {
                cVar1 = (char)(pQVar3->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                              super_QFlagsStorage<Qt::WindowType>.i;
                if (((cVar1 != '\x11') && (cVar1 != '\t')) &&
                   ((cVar1 != '\x03' || (*(long *)(*(long *)&pQVar10->field_0x8 + 0x10) == 0)))) {
                  bVar5 = QWidget::testAttribute_helper(pQVar10,WA_DontShowOnScreen);
                  if (!bVar5) {
                    e[0xc] = (QEvent)0x0;
                    QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_68);
                    goto LAB_002bd224;
                  }
                }
              }
            }
            QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_68);
            uVar6 = QCoreApplication::event((QEvent *)this);
            goto LAB_002bd16f;
          }
          goto LAB_002bd163;
        }
        goto LAB_002bd03a;
      }
      local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      topLevelWidgets();
      ppQVar4 = local_68.ptr;
      lVar14 = local_68.size << 3;
      for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
        pQVar10 = *(QWidget **)((long)ppQVar4 + lVar13);
        if ((char)(pQVar10->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                  super_QFlagsStorage<Qt::WindowType>.i != '\x11') {
          bVar5 = QWidget::testAttribute_helper(pQVar10,WA_SetLocale);
          if (!bVar5) {
            this_00 = *(QWidgetPrivate **)&pQVar10->field_0x8;
            QLocale::QLocale(&local_40);
            QWidgetPrivate::setLocale_helper(this_00,&local_40,true);
            QLocale::~QLocale(&local_40);
          }
        }
      }
    }
    QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_68);
  }
LAB_002bd163:
  uVar6 = QGuiApplication::event((QEvent *)this);
LAB_002bd16f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QApplication::event(QEvent *e)
{
    Q_D(QApplication);
    switch (e->type()) {
    case QEvent::Quit:
        // FIXME: This logic first tries to close all windows, and then
        // checks whether it was successful, but the conditions used in
        // closeAllWindows() differ from the verification logic below.
        // We should build on the logic in tryCloseAllWidgetWindows().
        closeAllWindows();
        for (auto *w : topLevelWidgets()) {
            if (w->data->is_closing)
                continue;
            if (w->isVisible() && !(w->windowType() == Qt::Desktop) && !(w->windowType() == Qt::Popup) &&
                 (!(w->windowType() == Qt::Dialog) || !w->parentWidget()) && !w->testAttribute(Qt::WA_DontShowOnScreen)) {
                e->ignore();
                return true;
            }
        }
        // Explicitly call QCoreApplication instead of QGuiApplication so that
        // we don't let QGuiApplication close any windows we skipped earlier in
        // closeAllWindows(). FIXME: Unify all this close magic through closeAllWindows.
        return QCoreApplication::event(e);
#ifndef Q_OS_WIN
    case QEvent::LocaleChange: {
        // on Windows the event propagation is taken care by the
        // WM_SETTINGCHANGE event handler.
        const QWidgetList list = topLevelWidgets();
        for (auto *w : list) {
            if (!(w->windowType() == Qt::Desktop)) {
                if (!w->testAttribute(Qt::WA_SetLocale))
                    w->d_func()->setLocale_helper(QLocale(), true);
            }
        }
        break;
    }
#endif
    case QEvent::Timer: {
        QTimerEvent *te = static_cast<QTimerEvent*>(e);
        Q_ASSERT(te != nullptr);
        if (te->timerId() == d->toolTipWakeUp.timerId()) {
            d->toolTipWakeUp.stop();
            if (d->toolTipWidget) {
                QWidget *w = d->toolTipWidget->window();
                // show tooltip if WA_AlwaysShowToolTips is set, or if
                // any ancestor of d->toolTipWidget is the active
                // window
                bool showToolTip = w->testAttribute(Qt::WA_AlwaysShowToolTips);
                while (w && !showToolTip) {
                    showToolTip = w->isActiveWindow();
                    w = w->parentWidget();
                    w = w ? w->window() : nullptr;
                }
                if (showToolTip) {
                    QHelpEvent e(QEvent::ToolTip, d->toolTipPos, d->toolTipGlobalPos);
                    QCoreApplication::sendEvent(d->toolTipWidget, &e);
                    if (e.isAccepted()) {
                        QStyle *s = d->toolTipWidget->style();
                        int sleepDelay = s->styleHint(QStyle::SH_ToolTip_FallAsleepDelay, nullptr, d->toolTipWidget, nullptr);
                        d->toolTipFallAsleep.start(sleepDelay, this);
                    }
                }
            }
        } else if (te->timerId() == d->toolTipFallAsleep.timerId()) {
            d->toolTipFallAsleep.stop();
        }
        break;
    }
#if QT_CONFIG(whatsthis)
    case QEvent::EnterWhatsThisMode:
        QWhatsThis::enterWhatsThisMode();
        return true;
#endif
    case QEvent::LanguageChange:
    case QEvent::ApplicationFontChange:
    case QEvent::ApplicationPaletteChange: {
        // QGuiApplication::event does not account for the cases where
        // there is a top level widget without a window handle. So they
        // need to have the event posted here
        const QWidgetList list = topLevelWidgets();
        for (auto *w : list) {
            if (!w->windowHandle() && (w->windowType() != Qt::Desktop))
                postEvent(w, new QEvent(e->type()));
        }
        break;
    }
    default:
        break;
    }

    return QGuiApplication::event(e);
}